

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O1

bool anon_unknown.dwarf_51134b::getFileContents
               (string *filename,vector<char,_std::allocator<char>_> *buffer)

{
  pointer *ppcVar1;
  uint uVar2;
  iterator __position;
  size_type __new_size;
  ifstream file;
  char local_221;
  long local_220 [4];
  uint auStack_200 [122];
  
  std::ifstream::ifstream(local_220,(filename->_M_dataplus)._M_p,_S_bin);
  uVar2 = *(uint *)((long)auStack_200 + *(long *)(local_220[0] + -0x18));
  if ((uVar2 & 5) == 0) {
    std::istream::seekg((long)local_220,_S_beg);
    __new_size = std::istream::tellg();
    if (0 < (long)__new_size) {
      std::istream::seekg((long)local_220,_S_beg);
      std::vector<char,_std::allocator<char>_>::resize(buffer,__new_size);
      std::istream::read((char *)local_220,
                         (long)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                               super__Vector_impl_data._M_start);
    }
    local_221 = '\0';
    __position._M_current =
         (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (__position._M_current ==
        (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                (buffer,__position,&local_221);
    }
    else {
      *__position._M_current = '\0';
      ppcVar1 = &(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
    }
  }
  std::ifstream::~ifstream(local_220);
  return (uVar2 & 5) == 0;
}

Assistant:

bool getFileContents(const std::string& filename, std::vector<char>& buffer)
    {
        std::ifstream file(filename.c_str(), std::ios_base::binary);
        if (file)
        {
            file.seekg(0, std::ios_base::end);
            std::ifstream::pos_type size = file.tellg();
            if (size > 0)
            {
                file.seekg(0, std::ios_base::beg);
                buffer.resize(static_cast<std::size_t>(size));
                file.read(&buffer[0], static_cast<std::streamsize>(size));
            }
            buffer.push_back('\0');
            return true;
        }
        else
        {
            return false;
        }
    }